

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O2

bool __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,FILE *stream,
          vector<char,_std::allocator<char>_> *input_vector,
          function<void_(unsigned_long)> *progress_callback)

{
  char *input_start;
  long lVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t __n;
  unsigned_long __args;
  ulong input_length;
  
  input_start = *(char **)input_vector;
  __args = 0;
  __n = 0;
  pcVar3 = input_start;
  while ((lVar1 = *(long *)(input_vector + 8),
         sVar4 = fread(input_start + __n,1,lVar1 - (long)(pcVar3 + __n),(FILE *)stream),
         (ulong)(lVar1 - (long)(pcVar3 + __n)) <= sVar4 ||
         (iVar2 = ferror((FILE *)stream), iVar2 == 0))) {
    input_length = __n + sVar4;
    if (input_length == 0) {
      return true;
    }
    sVar5 = decode(this,string,input_start,input_length,sVar4 == 0);
    __args = __args + sVar5;
    std::function<void_(unsigned_long)>::operator()(progress_callback,__args);
    __n = input_length - sVar5;
    if (sVar5 <= input_length && __n != 0) {
      __n = input_length - sVar5;
      memmove(input_start,input_start + sVar5,__n);
    }
    pcVar3 = *(char **)input_vector;
  }
  return false;
}

Assistant:

bool EncodingConversion::decode(u16string &string, FILE *stream,
                                vector<char> &input_vector,
                                function<void(size_t)> progress_callback) {
  char *input_buffer = input_vector.data();
  size_t bytes_left_over = 0;
  size_t total_bytes_read = 0;

  for (;;) {
    size_t bytes_to_read = input_vector.size() - bytes_left_over;
    size_t bytes_read = fread(input_buffer + bytes_left_over, 1, bytes_to_read, stream);
    if (bytes_read < bytes_to_read && ferror(stream)) return false;
    size_t bytes_to_append = bytes_left_over + bytes_read;
    if (bytes_to_append == 0) break;

    size_t bytes_appended = decode(
      string,
      input_buffer,
      bytes_to_append,
      bytes_read == 0
    );

    total_bytes_read += bytes_appended;
    progress_callback(total_bytes_read);

    if (bytes_appended < bytes_to_append) {
      std::copy(input_buffer + bytes_appended, input_buffer + bytes_to_append, input_buffer);
    }

    bytes_left_over = bytes_to_append - bytes_appended;
  }

  return true;
}